

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *data_00;
  uchar **ppuVar1;
  byte bVar2;
  curl_socket_t cVar3;
  TELNET *pTVar4;
  TELNET *pTVar5;
  uchar *puVar6;
  byte *pbVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  char cVar10;
  int iVar11;
  CURLcode CVar12;
  TELNET *pTVar13;
  char *pcVar14;
  curl_slist *pcVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  curl_slist *pcVar19;
  size_t sVar20;
  timediff_t tVar21;
  char *pcVar22;
  int option;
  uint nfds;
  uint uVar23;
  CURLcode CVar24;
  long size;
  long lVar25;
  bool bVar26;
  timediff_t timeout_ms;
  bool bVar27;
  curltime cVar28;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  char buffer [4096];
  uint local_10a4;
  ssize_t local_1080;
  pollfd local_1078;
  int local_1070;
  undefined2 local_106c;
  ushort local_106a;
  ulong local_1068;
  ulong local_1060;
  uchar *local_1058;
  long local_1050;
  long local_1048;
  connectdata *local_1040;
  char *local_1038 [513];
  
  local_1040 = data->conn;
  cVar3 = local_1040->sock[0];
  *done = true;
  pTVar13 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar13 == (TELNET *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_dyn_init(&pTVar13->out,0xffff);
  (data->req).p.telnet = pTVar13;
  pTVar13->telrcv_state = CURL_TS_DATA;
  pTVar13->subpointer = pTVar13->subbuffer;
  pTVar13->us_preferred[3] = 1;
  pTVar13->him_preferred[3] = 1;
  pTVar13->us_preferred[0] = 1;
  pTVar13->him_preferred[0] = 1;
  pTVar13->him_preferred[1] = 1;
  pTVar13->subnegotiation[0x1f] = 1;
  CVar24 = CURLE_OK;
  pTVar13 = (data->req).p.telnet;
  if ((data->state).aptr.user == (char *)0x0) {
LAB_0015b2e0:
    local_1060 = CONCAT44(local_1060._4_4_,cVar3);
    pcVar15 = (data->set).telnet_options;
    if (pcVar15 == (curl_slist *)0x0) {
      bVar27 = true;
      CVar24 = CURLE_OK;
    }
    else {
      CVar24 = CURLE_OK;
      do {
        pcVar14 = pcVar15->data;
        pcVar16 = strchr(pcVar14,0x3d);
        if (pcVar16 == (char *)0x0) {
LAB_0015b3f9:
          Curl_failf(data,"Syntax error in telnet option: %s",pcVar14);
          CVar24 = CURLE_SETOPT_OPTION_SYNTAX;
        }
        else {
          data_00 = pcVar16 + 1;
          pcVar22 = data_00;
          do {
            cVar10 = *pcVar22;
            pcVar22 = pcVar22 + 1;
          } while ('\0' < cVar10);
          if (cVar10 == '\0') {
            switch((long)pcVar16 - (long)pcVar14) {
            case 2:
              iVar11 = curl_strnequal(pcVar14,"WS",2);
              if (iVar11 != 0) {
                uVar17 = strtoul(data_00,local_1038,10);
                pcVar14 = local_1038[0];
                if ((uVar17 - 1 < 0xffff) &&
                   (cVar10 = Curl_raw_tolower(*local_1038[0]), cVar10 == 'x')) {
                  local_1038[0] = pcVar14 + 1;
                  uVar18 = strtoul(local_1038[0],(char **)0x0,10);
                  if (uVar18 - 1 < 0xffff) {
                    pTVar13->subopt_wsx = (unsigned_short)uVar17;
                    pTVar13->subopt_wsy = (unsigned_short)uVar18;
                    pTVar13->us_preferred[0x1f] = 1;
                  }
                }
                else {
                  uVar18 = 0;
                }
                if (uVar18 == 0) {
                  pcVar14 = pcVar15->data;
                  goto LAB_0015b3f9;
                }
                goto LAB_0015b518;
              }
              break;
            default:
              Curl_failf(data,"Unknown telnet option %s",pcVar14);
              break;
            case 5:
              iVar11 = curl_strnequal(pcVar14,"TTYPE",5);
              if (iVar11 != 0) {
                pTVar13->subopt_ttype = data_00;
                pTVar13->us_preferred[0x18] = 1;
                goto LAB_0015b518;
              }
              break;
            case 6:
              iVar11 = curl_strnequal(pcVar14,"BINARY",6);
              if (iVar11 != 0) {
                iVar11 = atoi(data_00);
                if (iVar11 != 1) {
                  pTVar13->us_preferred[0] = 0;
                  pTVar13->him_preferred[0] = 0;
                }
                goto LAB_0015b518;
              }
              break;
            case 7:
              iVar11 = curl_strnequal(pcVar14,"NEW_ENV",7);
              if (iVar11 != 0) {
                pcVar19 = curl_slist_append(pTVar13->telnet_vars,data_00);
                if (pcVar19 == (curl_slist *)0x0) {
                  CVar24 = CURLE_OUT_OF_MEMORY;
                }
                else {
                  pTVar13->telnet_vars = pcVar19;
                  pTVar13->us_preferred[0x27] = 1;
                }
                goto LAB_0015b518;
              }
              break;
            case 8:
              iVar11 = curl_strnequal(pcVar14,"XDISPLOC",8);
              if (iVar11 != 0) {
                pTVar13->subopt_xdisploc = data_00;
                pTVar13->us_preferred[0x23] = 1;
                goto LAB_0015b518;
              }
            }
            CVar24 = CURLE_UNKNOWN_OPTION;
          }
        }
LAB_0015b518:
        pcVar15 = pcVar15->next;
        bVar27 = CVar24 == CURLE_OK;
      } while ((pcVar15 != (curl_slist *)0x0) && (CVar24 == CURLE_OK));
    }
    if (!bVar27) {
      curl_slist_free_all(pTVar13->telnet_vars);
      pTVar13->telnet_vars = (curl_slist *)0x0;
    }
  }
  else {
    pcVar14 = data->conn->user;
    do {
      cVar10 = *pcVar14;
      pcVar14 = pcVar14 + 1;
    } while ('\0' < cVar10);
    if (cVar10 == '\0') {
      curl_msnprintf((char *)local_1038,0x100,"USER,%s");
      pcVar15 = curl_slist_append(pTVar13->telnet_vars,(char *)local_1038);
      if (pcVar15 == (curl_slist *)0x0) {
        curl_slist_free_all(pTVar13->telnet_vars);
        pTVar13->telnet_vars = (curl_slist *)0x0;
        CVar24 = CURLE_OUT_OF_MEMORY;
        goto LAB_0015b28d;
      }
      pTVar13->telnet_vars = pcVar15;
      pTVar13->us_preferred[0x27] = 1;
      bVar27 = true;
    }
    else {
      CVar24 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_0015b28d:
      bVar27 = false;
    }
    local_1060._0_4_ = cVar3;
    if (bVar27) goto LAB_0015b2e0;
  }
  if (CVar24 != CURLE_OK) {
    return CVar24;
  }
  local_1078.events = 1;
  uVar17 = *(ulong *)&(data->set).field_0x8ca;
  bVar27 = true;
  local_1078.fd = (curl_socket_t)local_1060;
  local_1060 = uVar17;
  if ((uVar17 & 2) == 0) {
    local_1070 = fileno((FILE *)(data->state).in);
    local_106c = 1;
    timeout_ms = 1000;
    nfds = 2;
    uVar23 = 2;
    if (local_1070 < 0) {
      bVar27 = false;
      Curl_failf(data,"cannot read input");
      CVar24 = CURLE_RECV_ERROR;
      goto LAB_0015b5f4;
    }
  }
  else {
    timeout_ms = 100;
    uVar23 = 1;
  }
  nfds = uVar23;
  CVar24 = CURLE_OK;
LAB_0015b5f4:
  local_1048 = 0;
  size = 0;
  do {
    do {
      bVar26 = bVar27;
      if (!bVar26) goto LAB_0015c039;
      iVar11 = Curl_poll(&local_1078,nfds,timeout_ms);
      bVar27 = false;
    } while (iVar11 == -1);
    if (iVar11 == 0) {
      local_1078.revents = 0;
      local_106a = 0;
    }
    if ((local_1078.revents & 1U) == 0) {
LAB_0015b63c:
      local_1080 = 0;
      if ((local_1060 & 2) == 0) {
        if ((local_106a & 1) != 0) {
          local_1080 = read(local_1070,local_1038,0x1000);
        }
      }
      else {
        sVar20 = (*(data->state).fread_func)((char *)local_1038,1,0x1000,(data->state).in);
        iVar11 = (int)sVar20;
        local_1080 = (ssize_t)iVar11;
        if (iVar11 == 0x10000000) {
LAB_0015b72d:
          bVar26 = false;
          goto LAB_0015bf72;
        }
        if (iVar11 == 0x10000001) goto LAB_0015bf72;
      }
      if (local_1080 < 1) {
        if (local_1080 != 0) {
          bVar26 = false;
        }
      }
      else {
        CVar12 = send_telnet_data(data,(char *)local_1038,local_1080);
        CVar24 = CURLE_OK;
        if (CVar12 == CURLE_OK) {
          local_1048 = local_1048 + local_1080;
          Curl_pgrsSetUploadCounter(data,local_1048);
        }
        else {
LAB_0015bf6c:
          CVar24 = CVar12;
          bVar26 = false;
        }
      }
    }
    else {
      CVar24 = Curl_xfer_recv(data,(char *)local_1038,0x1000,&local_1080);
      if (CVar24 == CURLE_OK) {
        if (0 < local_1080) {
          size = local_1080 + size;
          CVar12 = Curl_pgrsSetDownloadCounter(data,size);
          if (CVar12 == CURLE_OK) {
            local_1050 = local_1080;
            if (local_1080 == 0) {
              local_10a4 = 0xffffffff;
              local_1050 = 0;
            }
            else {
              pTVar4 = (data->req).p.telnet;
              ppuVar1 = &pTVar4->subpointer;
              local_1058 = pTVar4->subbuffer;
              local_10a4 = 0xffffffff;
              lVar25 = 0;
              do {
                if (CURL_TS_SE < pTVar4->telrcv_state) goto LAB_0015be83;
                bVar2 = *(byte *)((long)local_1038 + lVar25);
                uVar17 = (ulong)bVar2;
                uVar23 = (uint)bVar2;
                switch(pTVar4->telrcv_state) {
                case CURL_TS_DATA:
                  if (bVar2 == 0xd) {
                    pTVar4->telrcv_state = CURL_TS_CR;
                  }
                  else if (bVar2 == 0xff) {
                    pTVar4->telrcv_state = CURL_TS_IAC;
                    goto LAB_0015ba24;
                  }
LAB_0015bd92:
                  if ((int)local_10a4 < 0) {
                    local_10a4 = (uint)lVar25;
                  }
                  break;
                case CURL_TS_IAC:
switchD_0015b7cb_caseD_1:
                  switch(uVar23) {
                  case 0xfa:
                    pTVar4->subpointer = local_1058;
LAB_0015bba5:
                    pTVar4->telrcv_state = CURL_TS_SB;
                    break;
                  case 0xfb:
                    pTVar4->telrcv_state = CURL_TS_WILL;
                    break;
                  case 0xfc:
                    pTVar4->telrcv_state = CURL_TS_WONT;
                    break;
                  case 0xfd:
                    pTVar4->telrcv_state = CURL_TS_DO;
                    break;
                  case 0xfe:
                    pTVar4->telrcv_state = CURL_TS_DONT;
                    break;
                  case 0xff:
                    pTVar4->telrcv_state = CURL_TS_DATA;
                    goto LAB_0015bd92;
                  default:
                    pTVar4->telrcv_state = CURL_TS_DATA;
                    printoption(data,"RCVD",0xff,uVar23);
                  }
                  break;
                case CURL_TS_WILL:
                  printoption(data,"RCVD",0xfb,(uint)bVar2);
                  pTVar4->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar11 = pTVar5->him[uVar17];
                  if (iVar11 == 3) {
                    iVar11 = pTVar5->himq[uVar17];
                    if (iVar11 != 1) goto joined_r0x0015bc86;
                    pTVar5->him[uVar17] = 1;
                    pTVar5->himq[uVar17] = 0;
                  }
                  else if (iVar11 == 2) {
                    if (pTVar5->himq[uVar17] == 1) {
                      pTVar5->him[uVar17] = 3;
                      pTVar5->himq[uVar17] = 0;
                      goto LAB_0015be66;
                    }
                    if (pTVar5->himq[uVar17] == 0) {
                      pTVar5->him[uVar17] = 1;
                    }
                  }
                  else if (iVar11 == 0) {
                    if (pTVar5->him_preferred[uVar17] == 1) {
                      pTVar5->him[uVar17] = 1;
                      iVar11 = 0xfd;
                      goto LAB_0015be6e;
                    }
LAB_0015be66:
                    iVar11 = 0xfe;
LAB_0015be6e:
                    send_negotiation(data,iVar11,(uint)bVar2);
                  }
                  goto LAB_0015be78;
                case CURL_TS_WONT:
                  printoption(data,"RCVD",0xfc,(uint)bVar2);
                  pTVar4->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar11 = pTVar5->him[uVar17];
                  if (iVar11 == 3) {
                    iVar11 = pTVar5->himq[uVar17];
                    if (iVar11 == 1) {
                      pTVar5->him[uVar17] = 2;
                      pTVar5->himq[uVar17] = 0;
                      iVar11 = 0xfd;
LAB_0015bef2:
                      send_negotiation(data,iVar11,(uint)bVar2);
                    }
                    else {
joined_r0x0015bc86:
                      if (iVar11 == 0) {
                        pTVar5->him[uVar17] = 0;
                      }
                    }
                  }
                  else if (iVar11 == 2) {
                    iVar11 = pTVar5->himq[uVar17];
                    if (iVar11 != 1) goto joined_r0x0015bc86;
                    pTVar5->him[uVar17] = 0;
                    pTVar5->himq[uVar17] = 0;
                  }
                  else if (iVar11 == 1) {
                    pTVar5->him[uVar17] = 0;
                    goto LAB_0015be66;
                  }
                  goto LAB_0015be78;
                case CURL_TS_DO:
                  local_1068 = uVar17;
                  printoption(data,"RCVD",0xfd,(uint)bVar2);
                  uVar17 = local_1068;
                  pTVar4->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar11 = pTVar5->us[local_1068];
                  if (iVar11 == 3) {
                    if (pTVar5->usq[local_1068] == 1) {
                      pTVar5->us[local_1068] = 1;
                      pTVar5->usq[local_1068] = 0;
                    }
                    else if (pTVar5->usq[local_1068] == 0) {
                      pTVar5->us[local_1068] = 0;
                    }
                  }
                  else {
                    option = (int)local_1068;
                    if (iVar11 == 2) {
                      if (pTVar5->usq[local_1068] == 1) {
                        pTVar5->us[local_1068] = 3;
                        pTVar5->himq[local_1068] = 0;
LAB_0015be13:
                        send_negotiation(data,0xfc,option);
                      }
                      else if ((pTVar5->usq[local_1068] == 0) &&
                              (pTVar5->us[local_1068] = 1, pTVar5->subnegotiation[local_1068] == 1))
                      {
                        uVar17 = local_1068 & 0xffffffff;
                        goto LAB_0015bdf7;
                      }
                    }
                    else if (iVar11 == 0) {
                      if (pTVar5->us_preferred[local_1068] == 1) {
                        pTVar5->us[local_1068] = 1;
                        send_negotiation(data,0xfb,option);
                        uVar17 = local_1068;
                        if (pTVar5->subnegotiation[local_1068] != 1) goto LAB_0015be3c;
                      }
                      else {
                        if (pTVar5->subnegotiation[local_1068] != 1) goto LAB_0015be13;
                        pTVar5->us[local_1068] = 1;
                        send_negotiation(data,0xfb,option);
                        uVar17 = uVar17 & 0xffffffff;
                      }
LAB_0015bdf7:
                      sendsuboption(data,(int)uVar17);
                    }
                  }
LAB_0015be3c:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                  break;
                case CURL_TS_DONT:
                  printoption(data,"RCVD",0xfe,(uint)bVar2);
                  pTVar4->please_negotiate = 1;
                  pTVar5 = (data->req).p.telnet;
                  iVar11 = pTVar5->us[uVar17];
                  if (iVar11 == 3) {
                    iVar11 = pTVar5->usq[uVar17];
                    if (iVar11 == 1) {
                      pTVar5->us[uVar17] = 2;
                      pTVar5->usq[uVar17] = 0;
                      iVar11 = 0xfb;
                      goto LAB_0015bef2;
                    }
joined_r0x0015bcf5:
                    if (iVar11 == 0) {
                      pTVar5->us[uVar17] = 0;
                    }
                  }
                  else if (iVar11 == 2) {
                    iVar11 = pTVar5->usq[uVar17];
                    if (iVar11 != 1) goto joined_r0x0015bcf5;
                    pTVar5->us[uVar17] = 0;
                    pTVar5->usq[uVar17] = 0;
                  }
                  else if (iVar11 == 1) {
                    pTVar5->us[uVar17] = 0;
                    iVar11 = 0xfc;
                    goto LAB_0015be6e;
                  }
                  goto LAB_0015be78;
                case CURL_TS_CR:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                  if (bVar2 != 0) goto LAB_0015bd92;
LAB_0015ba24:
                  if ((int)local_10a4 < 0) {
                    local_10a4 = 0xffffffff;
                  }
                  else {
                    CVar12 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_10a4)
                                               ,(long)(int)((uint)lVar25 - local_10a4));
                    local_10a4 = 0xffffffff;
                    if (CVar12 != CURLE_OK) goto LAB_0015bf65;
                  }
                  break;
                case CURL_TS_SB:
                  if (bVar2 == 0xff) {
                    pTVar4->telrcv_state = CURL_TS_SE;
                  }
                  else {
                    pbVar7 = *ppuVar1;
                    if (pbVar7 < ppuVar1) {
                      *ppuVar1 = pbVar7 + 1;
                      *pbVar7 = bVar2;
                    }
                  }
                  break;
                case CURL_TS_SE:
                  puVar6 = *ppuVar1;
                  if (bVar2 != 0xf0) {
                    if (bVar2 != 0xff) {
                      if (puVar6 < ppuVar1) {
                        *ppuVar1 = puVar6 + 1;
                        *puVar6 = 0xff;
                      }
                      pbVar7 = *ppuVar1;
                      if (pbVar7 < ppuVar1) {
                        *ppuVar1 = pbVar7 + 1;
                        *pbVar7 = bVar2;
                      }
                      pTVar4->subend = pTVar4->subpointer + -2;
                      pTVar4->subpointer = local_1058;
                      local_1068 = uVar17;
                      printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar2);
                      suboption(data);
                      uVar23 = (uint)local_1068;
                      pTVar4->telrcv_state = CURL_TS_IAC;
                      goto switchD_0015b7cb_caseD_1;
                    }
                    if (puVar6 < ppuVar1) {
                      *ppuVar1 = puVar6 + 1;
                      *puVar6 = 0xff;
                    }
                    goto LAB_0015bba5;
                  }
                  if (puVar6 < ppuVar1) {
                    *ppuVar1 = puVar6 + 1;
                    *puVar6 = 0xff;
                  }
                  puVar6 = *ppuVar1;
                  if (puVar6 < ppuVar1) {
                    *ppuVar1 = puVar6 + 1;
                    *puVar6 = 0xf0;
                  }
                  pTVar4->subend = pTVar4->subpointer + -2;
                  pTVar4->subpointer = local_1058;
                  suboption(data);
LAB_0015be78:
                  pTVar4->telrcv_state = CURL_TS_DATA;
                }
LAB_0015be83:
                lVar25 = lVar25 + 1;
              } while (local_1050 != lVar25);
            }
            if (((int)local_10a4 < 0) ||
               (CVar12 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_10a4),
                                           (long)(int)((int)local_1050 - local_10a4)),
               CVar12 == CURLE_OK)) {
              CVar12 = CURLE_OK;
            }
          }
LAB_0015bf65:
          CVar24 = CURLE_OK;
          if (CVar12 == CURLE_OK) {
            if ((pTVar13->please_negotiate != 0) && (pTVar13->already_negotiated == 0)) {
              negotiate(data);
              pTVar13->already_negotiated = 1;
            }
            goto LAB_0015b63c;
          }
          goto LAB_0015bf6c;
        }
        bVar26 = false;
        CVar24 = CURLE_OK;
      }
      else if (CVar24 != CURLE_AGAIN) goto LAB_0015b72d;
    }
LAB_0015bf72:
    if ((data->set).timeout != 0) {
      cVar28 = Curl_now();
      uVar8 = (local_1040->created).tv_sec;
      uVar9 = (local_1040->created).tv_usec;
      older.tv_usec = uVar9;
      older.tv_sec = uVar8;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar28._0_12_,0);
      newer.tv_usec = SUB124(cVar28._0_12_,8);
      older._12_4_ = 0;
      tVar21 = Curl_timediff(newer,older);
      if ((long)(ulong)(data->set).timeout <= tVar21) {
        bVar26 = false;
        Curl_failf(data,"Time-out");
        CVar24 = CURLE_OPERATION_TIMEDOUT;
      }
    }
    iVar11 = Curl_pgrsUpdate(data);
    bVar27 = bVar26;
  } while (iVar11 == 0);
  CVar24 = CURLE_ABORTED_BY_CALLBACK;
LAB_0015c039:
  Curl_xfer_setup_nop(data);
  return CVar24;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* TODO: in test 1452, macOS sees a ECONNRESET sometimes?
           * Is this the telnet test server not shutting down the socket
           * in a clean way? Seems to be timing related, happens more
           * on slow debug build */
          if(data->state.os_errno == ECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}